

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O0

SUNErrCode SUNLinSolInitialize_SPFGMR(SUNLinearSolver S)

{
  int *piVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 *in_RDI;
  SUNLinearSolverContent_SPFGMR content;
  int k;
  SUNContext_conflict sunctx_local_scope_;
  int local_14;
  
  piVar1 = (int *)*in_RDI;
  if (piVar1[3] < 0) {
    piVar1[3] = 0;
  }
  if (((piVar1[1] != 1) && (piVar1[1] != 2)) && (piVar1[1] != 3)) {
    piVar1[1] = 0;
  }
  if (*(long *)(piVar1 + 0x18) == 0) {
    uVar2 = N_VCloneVectorArray(*piVar1 + 1,*(undefined8 *)(piVar1 + 0x24));
    *(undefined8 *)(piVar1 + 0x18) = uVar2;
  }
  if (*(long *)(piVar1 + 0x1a) == 0) {
    uVar2 = N_VCloneVectorArray(*piVar1 + 1,*(undefined8 *)(piVar1 + 0x24));
    *(undefined8 *)(piVar1 + 0x1a) = uVar2;
  }
  if (*(long *)(piVar1 + 0x1c) == 0) {
    pvVar3 = malloc((long)(*piVar1 + 1) << 3);
    *(void **)(piVar1 + 0x1c) = pvVar3;
    for (local_14 = 0; local_14 <= *piVar1; local_14 = local_14 + 1) {
      *(undefined8 *)(*(long *)(piVar1 + 0x1c) + (long)local_14 * 8) = 0;
      pvVar3 = malloc((long)*piVar1 << 3);
      *(void **)(*(long *)(piVar1 + 0x1c) + (long)local_14 * 8) = pvVar3;
    }
  }
  if (*(long *)(piVar1 + 0x1e) == 0) {
    pvVar3 = malloc((long)(*piVar1 << 1) << 3);
    *(void **)(piVar1 + 0x1e) = pvVar3;
  }
  if (*(long *)(piVar1 + 0x22) == 0) {
    pvVar3 = malloc((long)(*piVar1 + 1) << 3);
    *(void **)(piVar1 + 0x22) = pvVar3;
  }
  if (*(long *)(piVar1 + 0x26) == 0) {
    pvVar3 = malloc((long)(*piVar1 + 1) << 3);
    *(void **)(piVar1 + 0x26) = pvVar3;
  }
  if (*(long *)(piVar1 + 0x28) == 0) {
    pvVar3 = malloc((long)(*piVar1 + 1) << 3);
    *(void **)(piVar1 + 0x28) = pvVar3;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolInitialize_SPFGMR(SUNLinearSolver S)
{
  SUNFunctionBegin(S->sunctx);
  int k;
  SUNLinearSolverContent_SPFGMR content;

  /* set shortcut to SPFGMR memory structure */
  content = SPFGMR_CONTENT(S);

  /* ensure valid options */
  if (content->max_restarts < 0)
  {
    content->max_restarts = SUNSPFGMR_MAXRS_DEFAULT;
  }

  SUNAssert(content->ATimes, SUN_ERR_ARG_CORRUPT);

  if ((content->pretype != SUN_PREC_LEFT) &&
      (content->pretype != SUN_PREC_RIGHT) && (content->pretype != SUN_PREC_BOTH))
  {
    content->pretype = SUN_PREC_NONE;
  }

  SUNAssert((content->pretype == SUN_PREC_NONE) || (content->Psolve != NULL),
            SUN_ERR_ARG_CORRUPT);

  /* allocate solver-specific memory (where the size depends on the
     choice of maxl) here */

  /*   Krylov subspace vectors */
  if (content->V == NULL)
  {
    content->V = N_VCloneVectorArray(content->maxl + 1, content->vtemp);
    SUNCheckLastErr();
  }

  /*   Preconditioned basis vectors */
  if (content->Z == NULL)
  {
    content->Z = N_VCloneVectorArray(content->maxl + 1, content->vtemp);
    SUNCheckLastErr();
  }

  /*   Hessenberg matrix Hes */
  if (content->Hes == NULL)
  {
    content->Hes =
      (sunrealtype**)malloc((content->maxl + 1) * sizeof(sunrealtype*));
    SUNAssert(content->Hes, SUN_ERR_MALLOC_FAIL);

    for (k = 0; k <= content->maxl; k++)
    {
      content->Hes[k] = NULL;
      content->Hes[k] = (sunrealtype*)malloc(content->maxl * sizeof(sunrealtype));
      SUNAssert(content->Hes[k], SUN_ERR_MALLOC_FAIL);
    }
  }

  /*   Givens rotation components */
  if (content->givens == NULL)
  {
    content->givens =
      (sunrealtype*)malloc(2 * content->maxl * sizeof(sunrealtype));
    SUNAssert(content->givens, SUN_ERR_MALLOC_FAIL);
  }

  /*    y and g vectors */
  if (content->yg == NULL)
  {
    content->yg = (sunrealtype*)malloc((content->maxl + 1) * sizeof(sunrealtype));
    SUNAssert(content->yg, SUN_ERR_MALLOC_FAIL);
  }

  /*    cv vector for fused vector ops */
  if (content->cv == NULL)
  {
    content->cv = (sunrealtype*)malloc((content->maxl + 1) * sizeof(sunrealtype));
    SUNAssert(content->cv, SUN_ERR_MALLOC_FAIL);
  }

  /*    Xv vector for fused vector ops */
  if (content->Xv == NULL)
  {
    content->Xv = (N_Vector*)malloc((content->maxl + 1) * sizeof(N_Vector));
    SUNAssert(content->Xv, SUN_ERR_MALLOC_FAIL);
  }

  /* return with success */
  return SUN_SUCCESS;
}